

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::MergeFrom
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  int array_size;
  long *from;
  long *to;
  RepeatedField<long> *in_RSI;
  RepeatedField<long> *in_RDI;
  int in_stack_0000001c;
  RepeatedField<long> *in_stack_00000020;
  int existing_size;
  int in_stack_0000007c;
  RepeatedField<long> *in_stack_00000080;
  RepeatedField<long> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffec;
  
  if (in_RSI->current_size_ != 0) {
    array_size = size(in_RDI);
    size(in_RSI);
    Reserve(in_stack_00000080,in_stack_0000007c);
    size(in_RSI);
    AddNAlreadyReserved(in_RSI,in_stack_ffffffffffffffec);
    from = Mutable(in_stack_00000020,in_stack_0000001c);
    to = Get(in_stack_00000020,in_stack_0000001c);
    size(in_RSI);
    CopyArray(in_stack_ffffffffffffff80,to,from,array_size);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}